

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Get_block_info(int g_a,int *num_blocks,int *block_dims)

{
  Integer IVar1;
  long lVar2;
  Integer *num_blocks_00;
  Integer *pIVar3;
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  pIVar3 = local_a8;
  IVar1 = pnga_get_dimension((long)g_a);
  num_blocks_00 = local_68;
  pnga_get_block_info((long)g_a,num_blocks_00,local_a8);
  lVar2 = IVar1;
  if (0 < IVar1) {
    do {
      num_blocks[lVar2 + -1] = (int)*num_blocks_00;
      num_blocks_00 = num_blocks_00 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (0 < IVar1) {
    do {
      block_dims[IVar1 + -1] = *(int *)pIVar3;
      pIVar3 = (Integer *)((long)pIVar3 + 8);
      IVar1 = IVar1 + -1;
    } while (IVar1 != 0);
  }
  return;
}

Assistant:

void GA_Get_block_info(int g_a, int num_blocks[], int block_dims[])
{
     Integer aa, ndim;
     Integer _ga_work[MAXDIM], _ga_lo[MAXDIM];
     aa = (Integer)g_a;
     ndim = wnga_get_dimension(aa);
     wnga_get_block_info(aa, _ga_work, _ga_lo);
     COPYF2C(_ga_work,num_blocks, ndim);
     COPYF2C(_ga_lo,block_dims, ndim);
}